

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  float fVar1;
  bool bVar2;
  bool ignoreInput;
  int iVar3;
  GLFWwindow *handle;
  ImGuiIO *pIVar4;
  char *e;
  duration<double,std::ratio<1l,1l>> local_118 [8];
  duration<double,_std::ratio<1L,_1L>_> seconds;
  time_point now;
  float projection [16];
  float view [16];
  GLsizei local_80;
  int h;
  int w;
  byte local_71;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_70;
  bool firstframe;
  time_point lasttime;
  scene_t scene;
  GLFWwindow *window;
  bool single_image_mode;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  github111116::ConsoleLogger::info<char[10],int>(&console,(char (*) [10])"SH order:",&shorder);
  github111116::ConsoleLogger::info<char[14],char[10]>
            (&console,(char (*) [14])"shexp method:",(char (*) [10])"shexp_HYB");
  bVar2 = 1 < argc;
  if (bVar2) {
    github111116::ConsoleLogger::warn<char[18]>(&console,(char (*) [18])"single image mode");
  }
  glfwSetErrorCallback(error_callback);
  iVar3 = glfwInit();
  if (iVar3 == 0) {
    argv_local._4_4_ = 1;
  }
  else {
    glfwWindowHint(0x21001,8);
    glfwWindowHint(0x21002,8);
    glfwWindowHint(0x21003,8);
    glfwWindowHint(0x21004,8);
    glfwWindowHint(0x21005,0x20);
    glfwWindowHint(0x21006,-1);
    glfwWindowHint(0x22002,4);
    glfwWindowHint(0x22003,1);
    glfwWindowHint(0x22006,1);
    glfwWindowHint(0x22008,0x32001);
    glfwWindowHint(0x22007,1);
    glfwWindowHint(0x2100d,4);
    glfwWindowHint(0x20003,0);
    handle = glfwCreateWindow(0x3c0,0x21c,"Spherical Harmonics Playground",(GLFWmonitor *)0x0,
                              (GLFWwindow *)0x0);
    if (handle == (GLFWwindow *)0x0) {
      argv_local._4_4_ = 1;
    }
    else {
      glfwMakeContextCurrent(handle);
      gladLoadGLLoader(glfwGetProcAddress);
      glfwSwapInterval(0);
      ImGui_ImplGlfwGL3_Init(handle,true);
      lasttime.__d.__r = (duration)0;
      initScene((scene_t *)&lasttime);
      tStack_70.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      local_71 = 1;
      while (iVar3 = glfwWindowShouldClose(handle), iVar3 == 0) {
        glfwPollEvents();
        iVar3 = glfwGetKey(handle,0x52);
        if (iVar3 == 1) {
          destroyScene((scene_t *)&lasttime);
          initScene((scene_t *)&lasttime);
        }
        ImGui_ImplGlfwGL3_NewFrame();
        ImVec2::ImVec2((ImVec2 *)&h,300.0,300.0);
        ImGui::SetNextWindowSize((ImVec2 *)&h,4);
        ImGui::Begin("Coefficients",&main::show_another_window,0);
        pIVar4 = ImGui::GetIO();
        fVar1 = pIVar4->Framerate;
        pIVar4 = ImGui::GetIO();
        ImGui::Text("Application average %.3f ms/frame (%.1f FPS)",SUB84((double)(1000.0 / fVar1),0)
                    ,(double)pIVar4->Framerate);
        ImGui::End();
        glfwGetFramebufferSize(handle,&local_80,(int *)(view + 0xf));
        (*glad_glViewport)(0,0,local_80,(GLsizei)view[0xf]);
        ignoreInput = ImGui::IsAnyItemActive();
        fpsCameraViewMatrix(handle,projection + 0xe,ignoreInput);
        m_perspective44((float *)&now,FOV,(float)local_80 / (float)(int)view[0xf],0.01,100.0);
        drawScene((scene_t *)&lasttime,projection + 0xe,(float *)&now);
        if (!bVar2) {
          ImGui::Render();
        }
        glfwSwapBuffers(handle);
        if (bVar2) {
          saveImage("window_save.png",handle);
          break;
        }
        seconds.__r = (rep_conflict)std::chrono::_V2::system_clock::now();
        if ((local_71 & 1) == 0) {
          e = (char *)std::chrono::operator-
                                ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&seconds,&stack0xffffffffffffff90);
          std::chrono::duration<double,std::ratio<1l,1l>>::
          duration<long,std::ratio<1l,1000000000l>,void>
                    (local_118,(duration<long,_std::ratio<1L,_1000000000L>_> *)&e);
        }
        else {
          local_71 = 0;
        }
        tStack_70.__d.__r = (duration)(duration)seconds.__r;
      }
      destroyScene((scene_t *)&lasttime);
      ImGui_ImplGlfwGL3_Shutdown();
      glfwDestroyWindow(handle);
      glfwTerminate();
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
{
	console.info("SH order:", shorder);
	console.info("shexp method:", SHEXP_METHOD);
	bool single_image_mode = (argc>1);
	if (single_image_mode) {
		console.warn("single image mode");
	}
	try {
	glfwSetErrorCallback(error_callback);
	if (!glfwInit()) return 1;
	glfwWindowHint(GLFW_RED_BITS, 8);
	glfwWindowHint(GLFW_GREEN_BITS, 8);
	glfwWindowHint(GLFW_BLUE_BITS, 8);
	glfwWindowHint(GLFW_ALPHA_BITS, 8);
	glfwWindowHint(GLFW_DEPTH_BITS, 32);
	glfwWindowHint(GLFW_STENCIL_BITS, GLFW_DONT_CARE);
	glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 4);
	glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 1);
	glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
	glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
	glfwWindowHint(GLFW_OPENGL_DEBUG_CONTEXT, GL_TRUE);
	glfwWindowHint(GLFW_SAMPLES, 4);
	glfwWindowHint(GLFW_RESIZABLE, GLFW_FALSE);
	GLFWwindow *window = glfwCreateWindow(960, 540, "Spherical Harmonics Playground", NULL, NULL);
	if (!window) return 1;
	glfwMakeContextCurrent(window);
	gladLoadGLLoader((GLADloadproc)glfwGetProcAddress);
	glfwSwapInterval(0); // vsync disabled

	ImGui_ImplGlfwGL3_Init(window, true);

	scene_t scene = {0};
	initScene(&scene);
	// display_texture::init();
	auto lasttime = std::chrono::system_clock::now();
	bool firstframe = true;

	while (!glfwWindowShouldClose(window))
	{
		glfwPollEvents();
		if (glfwGetKey(window, GLFW_KEY_R) == GLFW_PRESS)
		{
			destroyScene(&scene);
			initScene(&scene);
		}
		ImGui_ImplGlfwGL3_NewFrame();

		ImGui::SetNextWindowSize(ImVec2(300, 300), ImGuiSetCond_FirstUseEver);
		static bool show_another_window = true;
		ImGui::Begin("Coefficients", &show_another_window);
		// for (int i = 0; i < 9; i++)
		// {
		// 	char name[] = "[?]";
		// 	name[1] = i + '0';
		// 	m_vec3 remapped = m_scale3(m_add3(scene.mesh.coefficients[i], m_v3(1.0f, 1.0f, 1.0f)), 0.5f);
		// 	ImGui::ColorEdit3(name, &remapped.x);
		// 	scene.mesh.coefficients[i] = m_sub3(m_scale3(remapped, 2.0f), m_v3(1.0f, 1.0f, 1.0f));
		// }
		ImGui::Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / ImGui::GetIO().Framerate, ImGui::GetIO().Framerate);
		ImGui::End();

		int w, h;
		glfwGetFramebufferSize(window, &w, &h);
		glViewport(0, 0, w, h);
		float view[16], projection[16];
		fpsCameraViewMatrix(window, view, ImGui::IsAnyItemActive());
		m_perspective44(projection, FOV, (float)w / (float)h, 0.01f, 100.0f);
		// console.warn("perspective");
		// for (int i=0; i<16; ++i)
		// 	console.log(projection[i]);
		drawScene(&scene, view, projection);
		// display_texture::draw();
		if (!single_image_mode) {
			ImGui::Render();
		}
		glfwSwapBuffers(window);
		if (single_image_mode) {
			saveImage("window_save.png", window);
			break;
		}
		// framerate
		auto now = std::chrono::system_clock::now();
		if (firstframe) {
			firstframe = false;
		}
		else {
			std::chrono::duration<double> seconds = now - lasttime;
			// console.log("frame draw time:", seconds.count());
		}
		lasttime = now;
	}

	destroyScene(&scene);
	ImGui_ImplGlfwGL3_Shutdown();
	glfwDestroyWindow(window);
	glfwTerminate();
	}
	catch (const char* e) {
		console.error(e);
		return 1;
	}
}